

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,IfStatement *statement)

{
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Statement *pSVar2;
  _Elt_pointer piVar3;
  pointer pcVar4;
  int iVar5;
  SubtreeWrapper *pSVar6;
  SubtreeWrapper *pSVar7;
  _Elt_pointer piVar8;
  LabelStatement *pLVar9;
  LabelStatement *pLVar10;
  SeqStatement *pSVar11;
  undefined4 extraout_var;
  JumpStatement *pJVar12;
  undefined4 extraout_var_00;
  SeqStatement *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  StatementWrapper *pSVar13;
  undefined4 extraout_var_03;
  Label *pLVar14;
  Label label_true;
  Label label_false;
  Label label_join;
  LabelStatement *local_228;
  Label *local_218;
  Label local_1f8;
  Label local_1d8;
  SubtreeWrapper *local_1b8;
  Label local_1b0;
  Label local_190;
  Label local_170;
  long *local_150 [2];
  long local_140 [2];
  size_type *local_130 [2];
  size_type local_120 [2];
  Label local_110;
  Label local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  Label local_b0;
  Label local_90;
  long *local_70 [2];
  long local_60 [2];
  Label local_50;
  
  pSVar2 = statement->else_statement_;
  local_1b8 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                        (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                         &statement->expression_->super_Node);
  this_00 = &this->offsets_;
  piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  piVar3 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  if (pSVar2 == (Statement *)0x0) {
    if (piVar8 == piVar3) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    this->current_layer_ =
         (this->current_layer_->children_).
         super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
         super__Vector_impl_data._M_start[piVar8[-1]];
    local_1f8.label_._M_dataplus._M_p._0_4_ = 0;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &statement->if_statement_->super_Node);
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar5 = piVar8[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    local_1f8.label_._M_dataplus._M_p._0_4_ = iVar5 + 1;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    IRT::Label::Label(&local_1f8);
    pLVar14 = &local_1d8;
    IRT::Label::Label(pLVar14);
    local_228 = (LabelStatement *)operator_new(0x28);
    paVar1 = &local_50.label_.field_2;
    local_50.label_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_1d8.label_._M_dataplus._M_p,
               local_1d8.label_._M_dataplus._M_p + local_1d8.label_._M_string_length);
    IRT::LabelStatement::LabelStatement(local_228,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.label_._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.label_._M_dataplus._M_p,
                      local_50.label_.field_2._M_allocated_capacity + 1);
    }
    if (pSVar6 != (SubtreeWrapper *)0x0) {
      pLVar9 = (LabelStatement *)operator_new(0x18);
      pLVar10 = (LabelStatement *)operator_new(0x28);
      local_f0.label_._M_dataplus._M_p = (pointer)&local_f0.label_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,
                 CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,
                          (int)local_1f8.label_._M_dataplus._M_p),
                 local_1f8.label_._M_string_length +
                 CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,
                          (int)local_1f8.label_._M_dataplus._M_p));
      IRT::LabelStatement::LabelStatement(pLVar10,&local_f0);
      pSVar11 = (SeqStatement *)operator_new(0x18);
      iVar5 = (*pSVar6->_vptr_SubtreeWrapper[3])(pSVar6);
      this_01 = (SeqStatement *)operator_new(0x18);
      pJVar12 = (JumpStatement *)operator_new(0x28);
      local_110.label_._M_dataplus._M_p = (pointer)&local_110.label_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_1d8.label_._M_dataplus._M_p,
                 local_1d8.label_._M_dataplus._M_p + local_1d8.label_._M_string_length);
      IRT::JumpStatement::JumpStatement(pJVar12,&local_110);
      IRT::SeqStatement::SeqStatement(this_01,(Statement *)pJVar12,(Statement *)local_228);
      IRT::SeqStatement::SeqStatement
                (pSVar11,(Statement *)CONCAT44(extraout_var_00,iVar5),(Statement *)this_01);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar9,(Statement *)pLVar10,(Statement *)pSVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.label_._M_dataplus._M_p != &local_110.label_.field_2) {
        operator_delete(local_110.label_._M_dataplus._M_p,
                        local_110.label_.field_2._M_allocated_capacity + 1);
      }
      pLVar14 = &local_1f8;
      local_228 = pLVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0.label_._M_dataplus._M_p != &local_f0.label_.field_2) {
        operator_delete(local_f0.label_._M_dataplus._M_p,
                        local_f0.label_.field_2._M_allocated_capacity + 1);
      }
    }
    pSVar13 = (StatementWrapper *)operator_new(0x10);
    pSVar11 = (SeqStatement *)operator_new(0x18);
    local_130[0] = local_120;
    pcVar4 = (pLVar14->label_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,pcVar4,pcVar4 + (pLVar14->label_)._M_string_length);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_1d8.label_._M_dataplus._M_p,
               local_1d8.label_._M_dataplus._M_p + local_1d8.label_._M_string_length);
    iVar5 = (*local_1b8->_vptr_SubtreeWrapper[4])(local_1b8,local_130,local_70);
    IRT::SeqStatement::SeqStatement
              (pSVar11,(Statement *)CONCAT44(extraout_var_02,iVar5),&local_228->super_Statement);
    IRT::StatementWrapper::StatementWrapper(pSVar13,(Statement *)pSVar11);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar13;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    local_170.label_._M_dataplus._M_p = (pointer)local_130[0];
    if (local_130[0] == local_120) goto LAB_00121b87;
  }
  else {
    if (piVar8 == piVar3) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    this->current_layer_ =
         (this->current_layer_->children_).
         super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
         super__Vector_impl_data._M_start[piVar8[-1]];
    local_1f8.label_._M_dataplus._M_p._0_4_ = 0;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &statement->if_statement_->super_Node);
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar5 = piVar8[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    local_1f8.label_._M_dataplus._M_p._0_4_ = iVar5 + 1;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    this->current_layer_ =
         (this->current_layer_->children_).
         super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
         super__Vector_impl_data._M_start[piVar8[-1]];
    local_1f8.label_._M_dataplus._M_p._0_4_ = 0;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar7 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &statement->else_statement_->super_Node);
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->offsets_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    iVar5 = piVar8[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&this_00->c);
    local_1f8.label_._M_dataplus._M_p._0_4_ = iVar5 + 1;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&this_00->c,(int *)&local_1f8);
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    IRT::Label::Label(&local_1f8);
    pLVar14 = &local_1d8;
    IRT::Label::Label(pLVar14);
    IRT::Label::Label(&local_170);
    pLVar9 = (LabelStatement *)operator_new(0x28);
    paVar1 = &local_90.label_.field_2;
    local_90.label_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_170.label_._M_dataplus._M_p,
               local_170.label_._M_dataplus._M_p + local_170.label_._M_string_length);
    IRT::LabelStatement::LabelStatement(pLVar9,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.label_._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.label_._M_dataplus._M_p,
                      local_90.label_.field_2._M_allocated_capacity + 1);
    }
    if (pSVar7 == (SubtreeWrapper *)0x0) {
      pLVar14 = &local_170;
      local_228 = pLVar9;
      local_218 = pLVar14;
      if (pSVar6 != (SubtreeWrapper *)0x0) goto LAB_001218c5;
    }
    else {
      local_228 = (LabelStatement *)operator_new(0x18);
      pLVar10 = (LabelStatement *)operator_new(0x28);
      local_190.label_._M_dataplus._M_p = (pointer)&local_190.label_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_1d8.label_._M_dataplus._M_p,
                 local_1d8.label_._M_dataplus._M_p + local_1d8.label_._M_string_length);
      IRT::LabelStatement::LabelStatement(pLVar10,&local_190);
      pSVar11 = (SeqStatement *)operator_new(0x18);
      iVar5 = (*pSVar7->_vptr_SubtreeWrapper[3])(pSVar7);
      IRT::SeqStatement::SeqStatement
                (pSVar11,(Statement *)CONCAT44(extraout_var,iVar5),(Statement *)pLVar9);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)local_228,(Statement *)pLVar10,(Statement *)pSVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.label_._M_dataplus._M_p != &local_190.label_.field_2) {
        operator_delete(local_190.label_._M_dataplus._M_p,
                        local_190.label_.field_2._M_allocated_capacity + 1);
      }
      if (pSVar6 == (SubtreeWrapper *)0x0) {
        local_218 = &local_170;
      }
      else {
        pLVar9 = (LabelStatement *)operator_new(0x18);
        pJVar12 = (JumpStatement *)operator_new(0x28);
        paVar1 = &local_b0.label_.field_2;
        local_b0.label_._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_170.label_._M_dataplus._M_p,
                   local_170.label_._M_dataplus._M_p + local_170.label_._M_string_length);
        IRT::JumpStatement::JumpStatement(pJVar12,&local_b0);
        IRT::SeqStatement::SeqStatement
                  ((SeqStatement *)pLVar9,(Statement *)pJVar12,(Statement *)local_228);
        pLVar14 = &local_1d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.label_._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0.label_._M_dataplus._M_p,
                          local_b0.label_.field_2._M_allocated_capacity + 1);
        }
LAB_001218c5:
        local_228 = (LabelStatement *)operator_new(0x18);
        pLVar10 = (LabelStatement *)operator_new(0x28);
        local_1b0.label_._M_dataplus._M_p = (pointer)&local_1b0.label_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,
                   CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,
                            (int)local_1f8.label_._M_dataplus._M_p),
                   local_1f8.label_._M_string_length +
                   CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,
                            (int)local_1f8.label_._M_dataplus._M_p));
        IRT::LabelStatement::LabelStatement(pLVar10,&local_1b0);
        pSVar11 = (SeqStatement *)operator_new(0x18);
        iVar5 = (*pSVar6->_vptr_SubtreeWrapper[3])(pSVar6);
        IRT::SeqStatement::SeqStatement
                  (pSVar11,(Statement *)CONCAT44(extraout_var_01,iVar5),&pLVar9->super_Statement);
        IRT::SeqStatement::SeqStatement
                  ((SeqStatement *)local_228,(Statement *)pLVar10,(Statement *)pSVar11);
        local_218 = &local_1f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0.label_._M_dataplus._M_p != &local_1b0.label_.field_2) {
          operator_delete(local_1b0.label_._M_dataplus._M_p,
                          local_1b0.label_.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pSVar13 = (StatementWrapper *)operator_new(0x10);
    pSVar11 = (SeqStatement *)operator_new(0x18);
    pcVar4 = (local_218->label_)._M_dataplus._M_p;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_150,pcVar4,pcVar4 + (local_218->label_)._M_string_length);
    local_d0[0] = local_c0;
    pcVar4 = (pLVar14->label_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar4,pcVar4 + (pLVar14->label_)._M_string_length);
    iVar5 = (*local_1b8->_vptr_SubtreeWrapper[4])(local_1b8,local_150,local_d0);
    IRT::SeqStatement::SeqStatement
              (pSVar11,(Statement *)CONCAT44(extraout_var_03,iVar5),&local_228->super_Statement);
    IRT::StatementWrapper::StatementWrapper(pSVar13,(Statement *)pSVar11);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar13;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_150[0] != local_140) {
      operator_delete(local_150[0],local_140[0] + 1);
    }
    local_120[0] = local_170.label_.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.label_._M_dataplus._M_p == &local_170.label_.field_2) goto LAB_00121b87;
  }
  operator_delete(local_170.label_._M_dataplus._M_p,local_120[0] + 1);
LAB_00121b87:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.label_._M_dataplus._M_p != &local_1d8.label_.field_2) {
    operator_delete(local_1d8.label_._M_dataplus._M_p,
                    local_1d8.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,(int)local_1f8.label_._M_dataplus._M_p) !=
      &local_1f8.label_.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1f8.label_._M_dataplus._M_p._4_4_,
                             (int)local_1f8.label_._M_dataplus._M_p),
                    local_1f8.label_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(IfStatement* statement) {
  if (statement->else_statement_ == nullptr) {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(
              true_stmt->ToStatement(),
              new IRT::SeqStatement(new IRT::JumpStatement(label_join),
                                    suffix)));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  } else {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto false_stmt = Accept(statement->else_statement_);
    offsets_.pop();
    index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_false;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (false_stmt) {
      result_false = &label_false;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_false),
          new IRT::SeqStatement(false_stmt->ToStatement(), suffix));

      if (true_stmt) {
        suffix =
            new IRT::SeqStatement(new IRT::JumpStatement(label_join), suffix);
      }
    }

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(true_stmt->ToStatement(), suffix));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  }
}